

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O0

size_t cmd_list_lookup_by_name(char *name)

{
  int iVar1;
  ulong local_20;
  size_t i;
  char *name_local;
  
  local_20 = 0;
  while( true ) {
    if (0x10 < local_20) {
      return 0xfffffffffffffffe;
    }
    iVar1 = strcmp(cmds_all[local_20].name,name);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

size_t cmd_list_lookup_by_name(const char *name)
{
	size_t i = 0;

	while (1) {
		if (i >= (int) N_ELEMENTS(cmds_all)) {
			/*
			 * Return a negative value other than -1 to prevent
			 * future lookups for the same name by ui-context.c.
			 * Those lookups are guaranteed to fail since the
			 * names in cmds_all don't change.
			 */
			return -2;
		}
		if (streq(cmds_all[i].name, name)) {
			return i;
		}
		++i;
	}
}